

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cc
# Opt level: O0

rune re2c::utf8::max_rune(uint32_t i)

{
  rune local_c;
  uint32_t i_local;
  
  switch(i) {
  case 1:
    local_c = 0x7f;
    break;
  case 2:
    local_c = 0x7ff;
    break;
  case 3:
    local_c = 0xffff;
    break;
  case 4:
    local_c = 0x10ffff;
    break;
  default:
    local_c = 0xfffd;
  }
  return local_c;
}

Assistant:

utf8::rune utf8::max_rune(uint32_t i)
{
	switch (i)
	{
		case 1:  return MAX_1BYTE_RUNE;
		case 2:  return MAX_2BYTE_RUNE;
		case 3:  return MAX_3BYTE_RUNE;
		case 4:  return MAX_4BYTE_RUNE;
		default: return ERROR;
	}
}